

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::SourceFilename_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDefPtr file)

{
  char *__str;
  char *in_RCX;
  string_view fname;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_38;
  FileDefPtr local_18;
  FileDefPtr file_local;
  
  local_18.ptr_ = (upb_FileDef *)this;
  file_local.ptr_ = (upb_FileDef *)__return_storage_ptr__;
  __str = FileDefPtr::name(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,__str);
  fname._M_str = in_RCX;
  fname._M_len = (size_t)local_48._M_str;
  StripExtension_abi_cxx11_(&local_38,(generator *)local_48._M_len,fname);
  std::operator+(__return_storage_ptr__,&local_38,".upb.c");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceFilename(upb::FileDefPtr file) {
  return StripExtension(file.name()) + ".upb.c";
}